

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_write.c
# Opt level: O1

ares_status_t ares_dns_write_rr_str(ares_buf_t *buf,ares_dns_rr_t *rr,ares_dns_rr_key_t key)

{
  ares_status_t aVar1;
  uchar *data;
  size_t data_len;
  
  data = (uchar *)ares_dns_rr_get_str(rr,key);
  aVar1 = ARES_EFORMERR;
  if (data != (uchar *)0x0) {
    data_len = ares_strlen((char *)data);
    if (data_len < 0x100) {
      aVar1 = ares_buf_append_byte(buf,(uchar)data_len);
      if (aVar1 == ARES_SUCCESS) {
        if (data_len != 0) {
          aVar1 = ares_buf_append(buf,data,data_len);
          return aVar1;
        }
        aVar1 = ARES_SUCCESS;
      }
    }
  }
  return aVar1;
}

Assistant:

static ares_status_t ares_dns_write_rr_str(ares_buf_t          *buf,
                                           const ares_dns_rr_t *rr,
                                           ares_dns_rr_key_t    key)
{
  const char   *str;
  size_t        len;
  ares_status_t status;

  str = ares_dns_rr_get_str(rr, key);
  if (str == NULL) {
    return ARES_EFORMERR; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  len = ares_strlen(str);
  if (len > 255) {
    return ARES_EFORMERR;
  }

  /* Write 1 byte length */
  status = ares_buf_append_byte(buf, (unsigned char)(len & 0xFF));
  if (status != ARES_SUCCESS) {
    return status; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  if (len == 0) {
    return ARES_SUCCESS;
  }

  /* Write string */
  return ares_buf_append(buf, (const unsigned char *)str, len);
}